

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

EdgeIdx __thiscall Escape::CGraph::getEdge(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  EdgeIdx EVar1;
  long lVar2;
  
  EVar1 = -1;
  if (v1 < this->nVertices) {
    for (lVar2 = this->offsets[v1];
        (EVar1 = -1, lVar2 < this->offsets[v1 + 1] && (EVar1 = lVar2, this->nbors[lVar2] != v2));
        lVar2 = lVar2 + 1) {
    }
  }
  return EVar1;
}

Assistant:

EdgeIdx CGraph::getEdge(VertexIdx v1, VertexIdx v2) const {
    if (v1 >= nVertices)
        return -1;
    for (EdgeIdx i = offsets[v1]; i < offsets[v1 + 1]; ++i)
        if (nbors[i] == v2)
            return i;
    return -1;
}